

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O3

LogicalType * __thiscall
duckdb::ArrowType::GetDuckType
          (LogicalType *__return_storage_ptr__,ArrowType *this,bool use_dictionary)

{
  pointer pcVar1;
  ArrowListInfo *pAVar2;
  LogicalType *pLVar3;
  pointer pAVar4;
  ArrowStructInfo *pAVar5;
  const_reference pvVar6;
  type pAVar7;
  string *psVar8;
  undefined7 in_register_00000011;
  size_type sVar9;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  undefined8 local_108;
  undefined8 uStack_100;
  pointer local_f8;
  LogicalType *local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_e8;
  LogicalType local_b0;
  LogicalType local_98;
  LogicalType local_80;
  child_list_t<LogicalType> local_68;
  child_list_t<LogicalType> local_48;
  
  if ((int)CONCAT71(in_register_00000011,use_dictionary) == 0) {
LAB_0178bd26:
    if ((this->extension_data).internal.
        super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
LAB_0178bd2c:
      this = (ArrowType *)
             shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator->(&this->extension_data);
    }
    pLVar3 = &this->type;
LAB_0178bd46:
    LogicalType::LogicalType(__return_storage_ptr__,pLVar3);
    return __return_storage_ptr__;
  }
  if ((this->dictionary_type).
      super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
      super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
      super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl != (ArrowType *)0x0) {
    this = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                     (&this->dictionary_type);
    goto LAB_0178bd26;
  }
  pLVar3 = &this->type;
  local_f0 = pLVar3;
  switch((this->type).id_) {
  case STRUCT:
    pAVar4 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
             operator->(&this->type_info);
    pAVar5 = ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(pAVar4);
    local_48.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_48.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    local_48.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_48.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = (pointer)0x0;
    if ((pAVar5->children).
        super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
        .
        super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pAVar5->children).
        super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
        .
        super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_48.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      sVar9 = 0;
      do {
        pvVar6 = vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true>::operator[]
                           (&pAVar5->children,sVar9);
        pAVar7 = shared_ptr<duckdb::ArrowType,_true>::operator*(pvVar6);
        psVar8 = StructType::GetChildName_abi_cxx11_(local_f0,sVar9);
        GetDuckType(&local_80,pAVar7,true);
        local_e8.first._M_dataplus._M_p = (pointer)&local_e8.first.field_2;
        pcVar1 = (psVar8->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,pcVar1,pcVar1 + psVar8->_M_string_length);
        LogicalType::LogicalType(&local_e8.second,&local_80);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_108,&local_e8);
        LogicalType::~LogicalType(&local_e8.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
          operator_delete(local_e8.first._M_dataplus._M_p);
        }
        LogicalType::~LogicalType(&local_80);
        sVar9 = sVar9 + 1;
      } while (sVar9 < (ulong)((long)(pAVar5->children).
                                     super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pAVar5->children).
                                     super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
      local_48.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
      local_48.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (undefined4)local_108;
      local_48.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = local_108._4_4_;
      local_48.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)uStack_100;
      local_48.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_100._4_4_;
    }
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = (pointer)0x0;
    LogicalType::STRUCT(__return_storage_ptr__,&local_48);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_48;
    break;
  case LIST:
    pAVar4 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
             operator->(&this->type_info);
    pAVar2 = ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(pAVar4);
    pAVar7 = shared_ptr<duckdb::ArrowType,_true>::operator*(&pAVar2->child);
    GetDuckType((LogicalType *)&local_e8,pAVar7,true);
    LogicalType::LIST(__return_storage_ptr__,(LogicalType *)&local_e8);
    goto LAB_0178bf66;
  case MAP:
    pAVar4 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
             operator->(&this->type_info);
    pAVar2 = ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(pAVar4);
    pAVar7 = shared_ptr<duckdb::ArrowType,_true>::operator*(&pAVar2->child);
    GetDuckType((LogicalType *)&local_e8,pAVar7,true);
    pLVar3 = StructType::GetChildType((LogicalType *)&local_e8,0);
    LogicalType::LogicalType(&local_98,pLVar3);
    pLVar3 = StructType::GetChildType((LogicalType *)&local_e8,1);
    LogicalType::LogicalType(&local_b0,pLVar3);
    LogicalType::MAP(__return_storage_ptr__,&local_98,&local_b0);
    LogicalType::~LogicalType(&local_b0);
    LogicalType::~LogicalType(&local_98);
LAB_0178bf66:
    LogicalType::~LogicalType((LogicalType *)&local_e8);
    return __return_storage_ptr__;
  default:
    if ((this->extension_data).internal.
        super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_0178bd46;
    goto LAB_0178bd2c;
  case UNION:
    pAVar4 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
             operator->(&this->type_info);
    pAVar5 = ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(pAVar4);
    local_68.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_68.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    local_68.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_68.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = (pointer)0x0;
    if ((pAVar5->children).
        super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
        .
        super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pAVar5->children).
        super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
        .
        super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_68.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      sVar9 = 0;
      do {
        pvVar6 = vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true>::operator[]
                           (&pAVar5->children,sVar9);
        pAVar7 = shared_ptr<duckdb::ArrowType,_true>::operator*(pvVar6);
        psVar8 = UnionType::GetMemberName_abi_cxx11_(local_f0,sVar9);
        GetDuckType(&local_80,pAVar7,true);
        local_e8.first._M_dataplus._M_p = (pointer)&local_e8.first.field_2;
        pcVar1 = (psVar8->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,pcVar1,pcVar1 + psVar8->_M_string_length);
        LogicalType::LogicalType(&local_e8.second,&local_80);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_108,&local_e8);
        LogicalType::~LogicalType(&local_e8.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
          operator_delete(local_e8.first._M_dataplus._M_p);
        }
        LogicalType::~LogicalType(&local_80);
        sVar9 = sVar9 + 1;
      } while (sVar9 < (ulong)((long)(pAVar5->children).
                                     super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pAVar5->children).
                                     super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
      local_68.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
      local_68.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (undefined4)local_108;
      local_68.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = local_108._4_4_;
      local_68.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)uStack_100;
      local_68.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_100._4_4_;
    }
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = (pointer)0x0;
    LogicalType::UNION(__return_storage_ptr__,&local_68);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_68;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(this_00);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

LogicalType ArrowType::GetDuckType(bool use_dictionary) const {
	if (use_dictionary && dictionary_type) {
		return dictionary_type->GetDuckType();
	}
	if (!use_dictionary) {
		if (extension_data) {
			return extension_data->GetDuckDBType();
		}
		return type;
	}
	// Dictionaries can exist in arbitrarily nested schemas
	// have to reconstruct the type
	auto id = type.id();
	switch (id) {
	case LogicalTypeId::STRUCT: {
		auto &struct_info = type_info->Cast<ArrowStructInfo>();
		child_list_t<LogicalType> new_children;
		for (idx_t i = 0; i < struct_info.ChildCount(); i++) {
			auto &child = struct_info.GetChild(i);
			auto &child_name = StructType::GetChildName(type, i);
			new_children.emplace_back(std::make_pair(child_name, child.GetDuckType(true)));
		}
		return LogicalType::STRUCT(std::move(new_children));
	}
	case LogicalTypeId::LIST: {
		auto &list_info = type_info->Cast<ArrowListInfo>();
		auto &child = list_info.GetChild();
		return LogicalType::LIST(child.GetDuckType(true));
	}
	case LogicalTypeId::MAP: {
		auto &list_info = type_info->Cast<ArrowListInfo>();
		auto &struct_child = list_info.GetChild();
		auto struct_type = struct_child.GetDuckType(true);
		return LogicalType::MAP(StructType::GetChildType(struct_type, 0), StructType::GetChildType(struct_type, 1));
	}
	case LogicalTypeId::UNION: {
		auto &union_info = type_info->Cast<ArrowStructInfo>();
		child_list_t<LogicalType> new_children;
		for (idx_t i = 0; i < union_info.ChildCount(); i++) {
			auto &child = union_info.GetChild(i);
			auto &child_name = UnionType::GetMemberName(type, i);
			new_children.emplace_back(std::make_pair(child_name, child.GetDuckType(true)));
		}
		return LogicalType::UNION(std::move(new_children));
	}
	default: {
		if (extension_data) {
			return extension_data->GetDuckDBType();
		}
		return type;
	}
	}
}